

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O2

IAddress * __thiscall IRT::CFrame::GetFramePointerAddress(CFrame *this)

{
  IAddress *pIVar1;
  
  pIVar1 = GetLocalVisibilityAddress(this,&framePointerAddressName_abi_cxx11_);
  return pIVar1;
}

Assistant:

const IAddress *CFrame::GetFramePointerAddress() const {
    return GetLocalVisibilityAddress(framePointerAddressName);
}